

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_short,_1U>::getUNORM
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_short,_1U> *this,uint32_t numChannels,uint32_t targetBits,uint32_t sBits)

{
  long lVar1;
  uint uVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint *puVar9;
  uint32_t uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  int iVar24;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  allocator_type local_3d;
  uint local_3c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  
  if (1 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x325,
                  "virtual std::vector<uint8_t> ImageT<unsigned short, 1>::getUNORM(uint32_t, uint32_t, uint32_t) const [componentType = unsigned short, componentCount = 1]"
                 );
  }
  if ((0x20 < targetBits) || ((0x100010100U >> ((ulong)targetBits & 0x3f) & 1) == 0)) {
    __assert_fail("targetBits == 8 || targetBits == 16 || targetBits == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x326,
                  "virtual std::vector<uint8_t> ImageT<unsigned short, 1>::getUNORM(uint32_t, uint32_t, uint32_t) const [componentType = unsigned short, componentCount = 1]"
                 );
  }
  uVar15 = targetBits >> 3;
  bVar3 = (byte)targetBits;
  local_3c = ~(-1 << ((byte)sBits & 0x1f)) << (bVar3 - (byte)sBits & 0x1f);
  uVar16 = 0;
  local_38 = __return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (ulong)(uVar15 * numChannels * (this->super_Image).height * (this->super_Image).width),
             &local_3d);
  auVar5 = _DAT_0017e500;
  auVar4 = _DAT_0017e4f0;
  uVar10 = (this->super_Image).height;
  if (uVar10 != 0) {
    local_3c = -(uint)(sBits == 0) | local_3c;
    uVar13 = -1 << (bVar3 & 0x1f);
    uVar6 = (this->super_Image).width;
    uVar14 = (ulong)targetBits - 1;
    auVar23._8_4_ = (int)uVar14;
    auVar23._0_8_ = uVar14;
    auVar23._12_4_ = (int)(uVar14 >> 0x20);
    auVar17._0_8_ = uVar14 >> 4;
    auVar17._8_8_ = auVar23._8_8_ >> 4;
    auVar17 = auVar17 ^ _DAT_0017e500;
    uVar11 = uVar6;
    do {
      if (uVar11 == 0) {
        uVar11 = 0;
      }
      else {
        uVar11 = 0;
        do {
          if (numChannels == 1) {
            uVar8 = uVar6 * uVar16 + uVar11;
            uVar6 = (uint)this->pixels[uVar8].field_0.comps[0];
            if (targetBits == 0x10) {
              puVar9 = (uint *)((local_38->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_start + uVar8 * uVar15);
LAB_001174ce:
              *(ushort *)puVar9 = (ushort)uVar6 & (ushort)local_3c;
            }
            else {
              if (targetBits < 0x10) {
                uVar12 = (uint)(this->pixels[uVar8].field_0.comps[0] >> (0x10 - bVar3 & 0x1f));
                uVar2 = 1 << (0xf - bVar3 & 0x1f) & uVar6;
                uVar6 = uVar12;
                if (uVar2 != 0) {
                  uVar6 = -uVar12 - 2;
                  if (uVar6 < uVar13) {
                    uVar6 = uVar13;
                  }
                  uVar6 = ~uVar6;
                }
              }
              else {
                lVar7 = 2;
                auVar18 = ZEXT816(0);
                iVar21 = 0;
                do {
                  auVar23 = auVar18;
                  auVar18._0_8_ = ((ulong)uVar6 << (ulong)(targetBits - iVar21)) >> 0x10;
                  auVar18._8_8_ = 0;
                  auVar18 = auVar18 | auVar23;
                  iVar21 = iVar21 + 0x20;
                  lVar1 = ((uVar14 >> 4) + 2 & 0xfffffffffffffffe) + lVar7;
                  lVar7 = lVar7 + -2;
                } while (lVar1 != 4);
                lVar7 = -lVar7;
                auVar19._8_4_ = (int)lVar7;
                auVar19._0_8_ = lVar7;
                auVar19._12_4_ = (int)((ulong)lVar7 >> 0x20);
                auVar19 = (auVar19 | auVar4) ^ auVar5;
                iVar21 = -(uint)(auVar17._0_4_ < auVar19._0_4_);
                auVar22._4_4_ = -(uint)(auVar17._4_4_ < auVar19._4_4_);
                iVar24 = -(uint)(auVar17._8_4_ < auVar19._8_4_);
                auVar22._12_4_ = -(uint)(auVar17._12_4_ < auVar19._12_4_);
                auVar25._4_4_ = iVar21;
                auVar25._0_4_ = iVar21;
                auVar25._8_4_ = iVar24;
                auVar25._12_4_ = iVar24;
                auVar20._4_4_ = -(uint)(auVar19._4_4_ == auVar17._4_4_);
                auVar20._12_4_ = -(uint)(auVar19._12_4_ == auVar17._12_4_);
                auVar20._0_4_ = auVar20._4_4_;
                auVar20._8_4_ = auVar20._12_4_;
                auVar22._0_4_ = auVar22._4_4_;
                auVar22._8_4_ = auVar22._12_4_;
                auVar22 = auVar22 | auVar20 & auVar25;
                auVar23 = ~auVar22 & auVar18 | auVar23 & auVar22;
                uVar6 = auVar23._8_4_ | auVar23._0_4_;
              }
              puVar9 = (uint *)((local_38->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_start + uVar8 * uVar15);
              if (targetBits == 0x20) {
                *puVar9 = uVar6 & local_3c;
              }
              else {
                if (targetBits == 0x10) goto LAB_001174ce;
                if (targetBits == 8) {
                  *(byte *)puVar9 = (byte)uVar6 & (byte)local_3c;
                }
              }
            }
            uVar6 = (this->super_Image).width;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < uVar6);
        uVar10 = (this->super_Image).height;
        uVar11 = uVar6;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < uVar10);
  }
  return local_38;
}

Assistant:

virtual std::vector<uint8_t> getUNORM(uint32_t numChannels, uint32_t targetBits, uint32_t sBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 8 || targetBits == 16 || targetBits == 32);

        const uint32_t sourceBits = sizeof(componentType) * 8;
        const uint32_t targetBytes = targetBits / 8;
        const uint32_t mask = (sBits == 0) ? 0xFFFFFFFF : ((1u << sBits) - 1u) << (targetBits - sBits);
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto sourceValue = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : Color::one());
                    const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, targetBits);
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (targetBytes == 1) {
                        const auto outValue = static_cast<uint8_t>(value & mask);
                        std::memcpy(target, &outValue, sizeof(outValue));
                    } else if (targetBytes == 2) {
                        const auto outValue = static_cast<uint16_t>(value & mask);
                        std::memcpy(target, &outValue, sizeof(outValue));
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<uint32_t>(value & mask);
                        std::memcpy(target, &outValue, sizeof(outValue));
                    }
                }
            }
        }

        return data;
    }